

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O0

void __thiscall
Script_SetStackData_kOpPushData2_Test::~Script_SetStackData_kOpPushData2_Test
          (Script_SetStackData_kOpPushData2_Test *this)

{
  Script_SetStackData_kOpPushData2_Test *this_local;
  
  ~Script_SetStackData_kOpPushData2_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Script, SetStackData_kOpPushData2) {
  // script作成
  ScriptBuilder builder;
  std::vector<uint8_t> bytes(256, 1);
  builder.AppendData(ByteData(bytes));
  Script script = builder.Build();

  size_t size = 1;
  EXPECT_EQ(script.IsEmpty(), false);
  EXPECT_EQ(script.GetElementList().size(), size);
  EXPECT_EQ(script.GetData().GetBytes()[0], 0x4d);
}